

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O1

self * __thiscall
boost::python::
class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
::def<boost::python::api::object,char_const*>
          (class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
           *this,char *name,object *a1,char **a2)

{
  object_base local_10;
  
  local_10.m_ptr = (a1->super_object_base).m_ptr;
  (local_10.m_ptr)->ob_refcnt = (local_10.m_ptr)->ob_refcnt + 1;
  def_maybe_overloads<boost::python::api::object,char_const*>(this,name,(object *)&local_10,a2,a2);
  (local_10.m_ptr)->ob_refcnt = (local_10.m_ptr)->ob_refcnt + -1;
  if ((local_10.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  return (self *)this;
}

Assistant:

object make_fn_impl(T*, D B::*pm_, mpl::false_, int*, mpl::true_)
    {
        D T::*pm = pm_;
        return python::make_setter(pm);
    }